

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::CapabilityTests::init(CapabilityTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  LimitTests::LimitTests((LimitTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ExtensionTests::ExtensionTests((ExtensionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void CapabilityTests::init (void)
{
	addChild(new LimitTests		(m_context));
	addChild(new ExtensionTests	(m_context));
}